

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O1

void __thiscall
cmCAString::cmCAString
          (cmCAString *this,cmCommandArgumentsHelper *args,char *key,cmCommandArgumentGroup *group)

{
  uint uVar1;
  
  cmCommandArgument::cmCommandArgument(&this->super_cmCommandArgument,args,key,group);
  (this->super_cmCommandArgument)._vptr_cmCommandArgument = (_func_int **)&PTR__cmCAString_005a7b90;
  (this->String)._M_dataplus._M_p = (pointer)&(this->String).field_2;
  (this->String)._M_string_length = 0;
  (this->String).field_2._M_local_buf[0] = '\0';
  uVar1 = 0;
  if (key != (char *)0x0) {
    uVar1 = (uint)(*key != '\0');
  }
  this->DataStart = uVar1;
  return;
}

Assistant:

cmCAString::cmCAString(cmCommandArgumentsHelper* args,
                       const char* key,
                       cmCommandArgumentGroup* group)
:cmCommandArgument(args, key, group)
{
  if ((key==0) || (*key==0))
    {
    this->DataStart = 0;
    }
  else
    {
    this->DataStart = 1;
    }
}